

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

void __thiscall kj::Path::Path(Path *this,StringPtr name)

{
  size_t in_RCX;
  StringPtr value;
  Array<char> AStack_28;
  
  value.content.ptr = (char *)name.content.size_;
  value.content.size_ = in_RCX;
  heapString((String *)&AStack_28,(kj *)name.content.ptr,value);
  Path(this,(String *)&AStack_28);
  Array<char>::~Array(&AStack_28);
  return;
}

Assistant:

Path::Path(StringPtr name): Path(heapString(name)) {}